

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_gen.c
# Opt level: O3

yajl_gen_status yajl_gen_double(yajl_gen g,double number)

{
  yajl_print_t p_Var1;
  void *pvVar2;
  uint uVar3;
  size_t sVar4;
  size_t sVar5;
  yajl_gen_state yVar6;
  uint _i;
  char *pcVar7;
  char i [32];
  char local_48 [32];
  
  yVar6 = g->state[g->depth];
  uVar3 = yVar6 - yajl_gen_map_start;
  if ((uVar3 < 7) && ((99U >> (uVar3 & 0x1f) & 1) != 0)) {
    return *(yajl_gen_status *)(&DAT_00107a3c + (ulong)uVar3 * 4);
  }
  if (0x7fefffffffffffff < (ulong)ABS(number)) {
    return yajl_gen_invalid_number;
  }
  if (yVar6 == yajl_gen_map_val) {
    (*g->print)(g->ctx,":",1);
    if ((g->flags & 1) != 0) {
      pcVar7 = " ";
      goto LAB_001052ec;
    }
  }
  else if ((yVar6 == yajl_gen_in_array) && ((*g->print)(g->ctx,",",1), (g->flags & 1) != 0)) {
    pcVar7 = "\n";
LAB_001052ec:
    (*g->print)(g->ctx,pcVar7,1);
  }
  if (((g->flags & 1) != 0) && (g->state[g->depth] != yajl_gen_map_val && (ulong)g->depth != 0)) {
    uVar3 = 0;
    do {
      p_Var1 = g->print;
      pvVar2 = g->ctx;
      pcVar7 = g->indentString;
      sVar4 = strlen(pcVar7);
      (*p_Var1)(pvVar2,pcVar7,sVar4 & 0xffffffff);
      uVar3 = uVar3 + 1;
    } while (uVar3 < g->depth);
  }
  sprintf(local_48,"%.20g",number);
  sVar4 = strspn(local_48,"0123456789-");
  sVar5 = strlen(local_48);
  if (sVar4 == sVar5) {
    sVar4 = strlen(local_48);
    (local_48 + sVar4)[0] = '.';
    (local_48 + sVar4)[1] = '0';
    local_48[sVar4 + 2] = '\0';
  }
  p_Var1 = g->print;
  pvVar2 = g->ctx;
  sVar4 = strlen(local_48);
  (*p_Var1)(pvVar2,local_48,sVar4 & 0xffffffff);
  uVar3 = g->depth;
  yVar6 = g->state[uVar3];
  switch(yVar6) {
  case yajl_gen_start:
    g->state[uVar3] = yajl_gen_complete;
    if ((g->flags & 1) == 0) {
      return yajl_gen_status_ok;
    }
    goto LAB_00105406;
  case yajl_gen_map_start:
  case yajl_gen_map_key:
    yVar6 = yajl_gen_map_val;
    break;
  case yajl_gen_map_val:
    yVar6 = yajl_gen_map_key;
    break;
  case yajl_gen_array_start:
    yVar6 = yajl_gen_in_array;
    break;
  default:
    goto switchD_001053d0_default;
  }
  g->state[uVar3] = yVar6;
switchD_001053d0_default:
  if (((g->flags & 1) != 0) && (yVar6 == yajl_gen_complete)) {
LAB_00105406:
    (*g->print)(g->ctx,"\n",1);
  }
  return yajl_gen_status_ok;
}

Assistant:

yajl_gen_status
yajl_gen_double(yajl_gen g, double number)
{
    char i[32];
    ENSURE_VALID_STATE; ENSURE_NOT_KEY;
    if (isnan(number) || isinf(number)) return yajl_gen_invalid_number;
    INSERT_SEP; INSERT_WHITESPACE;
    sprintf(i, "%.20g", number);
    if (strspn(i, "0123456789-") == strlen(i)) {
        strcat(i, ".0");
    }
    g->print(g->ctx, i, (unsigned int)strlen(i));
    APPENDED_ATOM;
    FINAL_NEWLINE;
    return yajl_gen_status_ok;
}